

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kurtosis.cpp
# Opt level: O2

AggregateFunction * duckdb::KurtosisPopFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  FunctionNullHandling in_R8B;
  LogicalType local_40 [24];
  
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,DOUBLE);
  duckdb::LogicalType::LogicalType(local_40,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::KurtosisState,double,double,duckdb::KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,local_40,(LogicalType *)0x0,in_R8B
            );
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  in_RDI->field_0xaa = 1;
  return in_RDI;
}

Assistant:

AggregateFunction KurtosisPopFun::GetFunction() {
	auto result = AggregateFunction::UnaryAggregate<KurtosisState, double, double,
	                                                KurtosisOperation<KurtosisFlagNoBiasCorrection>>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE);
	result.errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR;
	return result;
}